

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetAutoUicOptions
          (cmGeneratorTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result,string *config)

{
  char *pcVar1;
  string *arg;
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker;
  undefined1 local_110 [24];
  cmListFileBacktrace local_f8;
  string local_e8;
  string local_c8;
  cmGeneratorExpressionDAGChecker local_a8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"AUTOUIC_OPTIONS",(allocator<char> *)&local_e8);
  pcVar1 = GetLinkInterfaceDependentStringProperty(this,(string *)&local_a8,config);
  std::__cxx11::string::~string((string *)&local_a8);
  if (pcVar1 != (char *)0x0) {
    local_f8.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_f8.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)(local_110 + 8),&local_f8)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_f8.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"AUTOUIC_OPTIONS",(allocator<char> *)&local_e8);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&local_a8,this,&local_c8,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_c8);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_110,local_110 + 8);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_local_buf[0] = '\0';
    arg = cmCompiledGeneratorExpression::Evaluate
                    ((cmCompiledGeneratorExpression *)local_110._0_8_,this->LocalGenerator,config,
                     false,this,&local_a8,&local_e8);
    cmSystemTools::ExpandListArgument(arg,result,false);
    std::__cxx11::string::~string((string *)&local_e8);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_110);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&local_a8);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)(local_110 + 8));
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetAutoUicOptions(std::vector<std::string>& result,
                                          const std::string& config) const
{
  const char* prop =
    this->GetLinkInterfaceDependentStringProperty("AUTOUIC_OPTIONS", config);
  if (!prop) {
    return;
  }
  cmGeneratorExpression ge;

  cmGeneratorExpressionDAGChecker dagChecker(this, "AUTOUIC_OPTIONS", nullptr,
                                             nullptr);
  cmSystemTools::ExpandListArgument(
    ge.Parse(prop)->Evaluate(this->LocalGenerator, config, false, this,
                             &dagChecker),
    result);
}